

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O3

void mahjong::adjust_by_winds
               (tile_t tile,wind_t prevalent_wind,wind_t seat_wind,fan_table_t *fan_table)

{
  wind_t wVar1;
  bool bVar2;
  
  if ((((*fan_table)[0x26] == 0) && ((*fan_table)[0x12] == 0)) && ((*fan_table)[0xb] == 0)) {
    bVar2 = (*fan_table)[9] != 0;
    wVar1 = (uint)(byte)(tile + 0xbf);
    if ((byte)(tile + 0xbf) == prevalent_wind) {
      (*fan_table)[0x3c] = 1;
      bVar2 = true;
      wVar1 = prevalent_wind;
      if ((*fan_table)[9] == 0) {
        (*fan_table)[0x49] = (*fan_table)[0x49] - 1;
        bVar2 = false;
      }
    }
  }
  else {
    bVar2 = true;
    wVar1 = (uint)(byte)(tile + 0xbf);
    if ((byte)(tile + 0xbf) == prevalent_wind) {
      (*fan_table)[0x3c] = 1;
      wVar1 = prevalent_wind;
    }
  }
  if ((wVar1 == seat_wind) && ((*fan_table)[0x3d] = 1, !(bool)(seat_wind == prevalent_wind | bVar2))
     ) {
    (*fan_table)[0x49] = (*fan_table)[0x49] - 1;
  }
  return;
}

Assistant:

static void adjust_by_winds(tile_t tile, wind_t prevalent_wind, wind_t seat_wind, fan_table_t &fan_table) {
    // 三风刻、混幺九、字一色、小四喜，这些番种已经扣除过幺九刻了
    bool is_deducted = (fan_table[BIG_THREE_WINDS] || fan_table[ALL_TERMINALS_AND_HONORS] || fan_table[ALL_HONORS] || fan_table[LITTLE_FOUR_WINDS]);

    rank_t delta = tile - TILE_E;
    if (delta == static_cast<int>(prevalent_wind) - static_cast<int>(wind_t::EAST)) {
        fan_table[PREVALENT_WIND] = 1;
        if (!is_deducted) {
            --fan_table[PUNG_OF_TERMINALS_OR_HONORS];
        }
    }
    if (delta == static_cast<int>(seat_wind) - static_cast<int>(wind_t::EAST)) {
        fan_table[SEAT_WIND] = 1;
        // 当圈风门风相同时，已经扣除过幺九刻了
        if (seat_wind != prevalent_wind && !is_deducted) {
            --fan_table[PUNG_OF_TERMINALS_OR_HONORS];
        }
    }
}